

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::
Bind<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,std::vector<int,std::allocator<int>>,cmCMakePresetsGraph::ReadFileResult(*)(std::vector<int,std::allocator<int>>&,Json::Value_const*)>
          (Object<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *this,
          string_view *name,offset_in_IndexOptions_to_vector<int,_std::allocator<int>_> member,
          _func_ReadFileResult_vector<int,_std::allocator<int>_>_ptr_Value_ptr *func,bool required)

{
  Object<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *pOVar1;
  anon_class_16_2_47de0b2f local_60;
  MemberFunction local_50;
  byte local_29;
  _func_ReadFileResult_vector<int,_std::allocator<int>_>_ptr_Value_ptr *p_Stack_28;
  bool required_local;
  _func_ReadFileResult_vector<int,_std::allocator<int>_>_ptr_Value_ptr *func_local;
  offset_in_IndexOptions_to_vector<int,_std::allocator<int>_> member_local;
  string_view *name_local;
  Object<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *this_local;
  
  local_60.func = func;
  local_60.member = member;
  local_29 = required;
  p_Stack_28 = func;
  func_local = (_func_ReadFileResult_vector<int,_std::allocator<int>_>_ptr_Value_ptr *)member;
  member_local = (offset_in_IndexOptions_to_vector<int,_std::allocator<int>_>)name;
  name_local = (string_view *)this;
  std::
  function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::Bind<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,std::vector<int,std::allocator<int>>,cmCMakePresetsGraph::ReadFileResult(*)(std::vector<int,std::allocator<int>>&,Json::Value_const*)>(std::basic_string_view<char,std::char_traits<char>>const&,std::vector<int,std::allocator<int>>cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions::*,cmCMakePresetsGraph::ReadFileResult(*)(std::vector<int,std::allocator<int>>&,Json::Value_const*),bool)::_lambda(cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions&,Json::Value_const*)>
              *)&local_50,&local_60);
  pOVar1 = BindPrivate(this,name,&local_50,(bool)(local_29 & 1));
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions_&,_const_Json::Value_*)>
  ::~function(&local_50);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }